

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
     ::operate(View<short,_false,_std::allocator<unsigned_long>_> *v,undefined8 x,long param_3)

{
  size_t sVar1;
  size_t j;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,7);
    if (sVar1 <= uVar2) break;
    OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::DividedByEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
    ::operate(v,x,param_3);
    sVar1 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,7);
    param_3 = param_3 + sVar1 * 2;
    uVar2 = uVar2 + 1;
  }
  View<short,_false,_std::allocator<unsigned_long>_>::shape(v,7);
  View<short,_false,_std::allocator<unsigned_long>_>::strides(v,7);
  return;
}

Assistant:

static inline void operate
    (
        View<T1, false, A>& v, 
        const T2& x, 
        Functor f, 
        T1* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperBinaryScalar<N-1, Functor, T1, T2, A>::operate(
                v, x, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }